

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_packet_add(LIBSSH2_SFTP *sftp,uchar *data,size_t data_len)

{
  LIBSSH2_SESSION *session_00;
  uint uVar1;
  uint32_t request_id_00;
  sftp_zombie_requests *psVar2;
  list_node *entry;
  uint32_t request_id;
  LIBSSH2_SFTP_PACKET *packet;
  LIBSSH2_SESSION *session;
  size_t data_len_local;
  uchar *data_local;
  LIBSSH2_SFTP *sftp_local;
  
  session_00 = sftp->channel->session;
  if (data_len < 5) {
    sftp_local._4_4_ = -0x29;
  }
  else {
    uVar1 = (uint)*data;
    if (((uVar1 - 1 < 0x14) || (uVar1 - 0x65 < 5)) || (uVar1 == 200 || uVar1 == 0xc9)) {
      request_id_00 = _libssh2_ntohu32(data + 1);
      if (((*data == 'e') || (*data == 'g')) &&
         (psVar2 = find_zombie_request(sftp,request_id_00), psVar2 != (sftp_zombie_requests *)0x0))
      {
        (*session_00->free)(data,&session_00->abstract);
        remove_zombie_request(sftp,request_id_00);
        sftp_local._4_4_ = 0;
      }
      else {
        entry = (list_node *)(*session_00->alloc)(0x30,&session_00->abstract);
        if (entry == (list_node *)0x0) {
          sftp_local._4_4_ =
               _libssh2_error(session_00,-6,"Unable to allocate datablock for SFTP packet");
        }
        else {
          entry[1].prev = (list_node *)data;
          entry[1].head = (list_head *)data_len;
          *(uint32_t *)&entry[1].next = request_id_00;
          _libssh2_list_add(&sftp->packets,entry);
          sftp_local._4_4_ = 0;
        }
      }
    }
    else {
      sftp->last_errno = 0;
      sftp_local._4_4_ = _libssh2_error(session_00,-0x1f,"Out of sync with the world");
    }
  }
  return sftp_local._4_4_;
}

Assistant:

static int
sftp_packet_add(LIBSSH2_SFTP *sftp, unsigned char *data,
                size_t data_len)
{
    LIBSSH2_SESSION *session = sftp->channel->session;
    LIBSSH2_SFTP_PACKET *packet;
    uint32_t request_id;

    if(data_len < 5) {
        return LIBSSH2_ERROR_OUT_OF_BOUNDARY;
    }

    _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                   "Received packet type %u (len %lu)",
                   (unsigned int)data[0], (unsigned long)data_len));

    /*
     * Experience shows that if we mess up EAGAIN handling somewhere or
     * otherwise get out of sync with the channel, this is where we first get
     * a wrong byte and if so we need to bail out at once to aid tracking the
     * problem better.
     */

    switch(data[0]) {
    case SSH_FXP_INIT:
    case SSH_FXP_VERSION:
    case SSH_FXP_OPEN:
    case SSH_FXP_CLOSE:
    case SSH_FXP_READ:
    case SSH_FXP_WRITE:
    case SSH_FXP_LSTAT:
    case SSH_FXP_FSTAT:
    case SSH_FXP_SETSTAT:
    case SSH_FXP_FSETSTAT:
    case SSH_FXP_OPENDIR:
    case SSH_FXP_READDIR:
    case SSH_FXP_REMOVE:
    case SSH_FXP_MKDIR:
    case SSH_FXP_RMDIR:
    case SSH_FXP_REALPATH:
    case SSH_FXP_STAT:
    case SSH_FXP_RENAME:
    case SSH_FXP_READLINK:
    case SSH_FXP_SYMLINK:
    case SSH_FXP_STATUS:
    case SSH_FXP_HANDLE:
    case SSH_FXP_DATA:
    case SSH_FXP_NAME:
    case SSH_FXP_ATTRS:
    case SSH_FXP_EXTENDED:
    case SSH_FXP_EXTENDED_REPLY:
        break;
    default:
        sftp->last_errno = LIBSSH2_FX_OK;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "Out of sync with the world");
    }

    request_id = _libssh2_ntohu32(&data[1]);

    _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Received packet id %d",
                   request_id));

    /* Don't add the packet if it answers a request we've given up on. */
    if((data[0] == SSH_FXP_STATUS || data[0] == SSH_FXP_DATA)
       && find_zombie_request(sftp, request_id)) {

        /* If we get here, the file ended before the response arrived. We
           are no longer interested in the request so we discard it */

        LIBSSH2_FREE(session, data);

        remove_zombie_request(sftp, request_id);
        return LIBSSH2_ERROR_NONE;
    }

    packet = LIBSSH2_ALLOC(session, sizeof(LIBSSH2_SFTP_PACKET));
    if(!packet) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate datablock for SFTP packet");
    }

    packet->data = data;
    packet->data_len = data_len;
    packet->request_id = request_id;

    _libssh2_list_add(&sftp->packets, &packet->node);

    return LIBSSH2_ERROR_NONE;
}